

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

void __thiscall blc::tools::VFile::VFile(VFile *this,VFile *vFile)

{
  _Ios_Openmode _Var1;
  long in_RSI;
  stream *in_RDI;
  VFile *in_stack_00000090;
  
  stream::stream(in_RDI);
  in_RDI->_vptr_stream = (_func_int **)&PTR_write_00130c98;
  _Var1 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(in_RDI + 1,(string *)(in_RSI + 0x240),_Var1);
  std::__cxx11::string::string((string *)(in_RDI + 0x43));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),(string *)(in_RSI + 0x240));
  refresh(in_stack_00000090);
  return;
}

Assistant:

blc::tools::VFile::VFile(VFile&& vFile) : _file(vFile._fileName) {
	this->_fileName = vFile._fileName;
	this->refresh();
}